

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  int __val;
  long lVar1;
  PyObject *pPVar2;
  string *in_RDI;
  PyTypeObject *pPVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [24];
  object local_90;
  handle local_88;
  handle local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  PyTypeObject *local_58;
  undefined1 local_50 [8];
  error_scope scope;
  
  lVar1 = PyErr_Occurred();
  scope.trace = (PyObject *)in_RDI;
  if (lVar1 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    std::__cxx11::string::string
              ((string *)in_RDI,"Unknown internal error occurred",(allocator *)&local_78);
  }
  else {
    error_scope::error_scope((error_scope *)local_50);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    if (local_50 != (undefined1  [8])0x0) {
      local_a8._8_8_ = local_50;
      local_a8._16_8_ = "__name__";
      local_90.super_handle.m_ptr = (handle)(PyObject *)0x0;
      accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                (&local_78,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_a8);
      pPVar2 = scope.trace;
      std::__cxx11::string::append((string *)scope.trace);
      std::__cxx11::string::~string((string *)&local_78);
      object::~object(&local_90);
      std::__cxx11::string::append((char *)pPVar2);
    }
    if (scope.type != (PyObject *)0x0) {
      local_a8._0_8_ = PyObject_Str();
      str::operator_cast_to_string(&local_78,(str *)local_a8);
      std::__cxx11::string::append((string *)scope.trace);
      std::__cxx11::string::~string((string *)&local_78);
      object::~object((object *)local_a8);
    }
    PyErr_NormalizeException(local_50,&scope,&scope.value);
    if (scope.value != (PyObject *)0x0) {
      PyException_SetTraceback(scope.type);
      if (scope.value != (PyObject *)0x0) {
        do {
          pPVar2 = scope.value;
          scope.value = (PyObject *)pPVar2[1].ob_refcnt;
        } while (scope.value != (PyObject *)0x0);
        pPVar3 = pPVar2[1].ob_type;
        std::__cxx11::string::append((char *)scope.trace);
        while (pPVar3 != (PyTypeObject *)0x0) {
          __val = PyFrame_GetLineNumber(pPVar3);
          local_88.m_ptr = *(PyObject **)(pPVar3->tp_basicsize + 0x68);
          local_58 = pPVar3;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_148,&local_88);
          std::operator+(&local_168,"  ",&local_148);
          std::operator+(&local_c8,&local_168,"(");
          std::__cxx11::to_string(&local_128,__val);
          std::operator+(&local_188,&local_c8,&local_128);
          std::operator+(&local_e8,&local_188,"): ");
          local_80.m_ptr = *(PyObject **)(local_58->tp_basicsize + 0x70);
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_108,&local_80);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8,&local_e8,&local_108);
          std::operator+(&local_78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8,"\n");
          std::__cxx11::string::append((string *)scope.trace);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)local_a8);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_148);
          pPVar3 = (PyTypeObject *)local_58->tp_name;
        }
      }
    }
    error_scope::~error_scope((error_scope *)local_50);
  }
  return (string *)scope.trace;
}

Assistant:

PYBIND11_NOINLINE inline std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value)
        errorString += (std::string) str(scope.value);

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr)
        PyException_SetTraceback(scope.value, scope.trace);
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        PyTracebackObject *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next)
            trace = trace->tb_next;

        PyFrameObject *frame = trace->tb_frame;
        errorString += "\n\nAt:\n";
        while (frame) {
            int lineno = PyFrame_GetLineNumber(frame);
            errorString +=
                "  " + handle(frame->f_code->co_filename).cast<std::string>() +
                "(" + std::to_string(lineno) + "): " +
                handle(frame->f_code->co_name).cast<std::string>() + "\n";
            frame = frame->f_back;
        }
    }
#endif

    return errorString;
}